

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFreloc.c
# Opt level: O3

void NFreloc(NF_link_map *l,ProxyRecord *records)

{
  byte *__s2;
  uint uVar1;
  Elf64_Xword EVar2;
  Elf64_Xword EVar3;
  void *pvVar4;
  Elf64_Xword EVar5;
  Elf64_Xword EVar6;
  Elf32_Word *pEVar7;
  bool bVar8;
  bool bVar9;
  Elf64_Dyn *pEVar10;
  int iVar11;
  Elf64_Rela *it;
  long *plVar12;
  undefined8 uVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  NF_link_map **ppNVar19;
  byte *pbVar20;
  void *pvVar21;
  long *plVar22;
  Elf64_Dyn *pEVar23;
  long *plVar24;
  void **ppvVar25;
  ulong uVar26;
  NF_link_map *local_a8;
  
  if (l->l_info[7] != (Elf64_Dyn *)0x0) {
    ranges[0].start = (l->l_info[7]->d_un).d_ptr;
    ranges[0].size = (l->l_info[8]->d_un).d_ptr;
    ranges[0].nrelative = (l->l_info[0x22]->d_un).d_val;
  }
  if (l->l_info[0x14] != (Elf64_Dyn *)0x0) {
    ranges[1].start = (l->l_info[0x17]->d_un).d_ptr;
    ranges[1].size = (l->l_info[2]->d_un).d_ptr;
  }
  bVar8 = true;
  lVar18 = 0;
  do {
    plVar12 = (long *)ranges[lVar18].start;
    plVar24 = plVar12 + ranges[lVar18].nrelative * 3;
    plVar22 = (long *)(ranges[lVar18].size + (long)plVar12);
    if (0 < (long)ranges[lVar18].nrelative) {
      do {
        *(uint64_t *)(*plVar12 + l->l_addr) = plVar12[2] + l->l_addr;
        plVar12 = plVar12 + 3;
      } while (plVar12 < plVar24);
    }
    if (plVar24 < plVar22) {
      EVar2 = (l->l_info[6]->d_un).d_val;
      EVar3 = (l->l_info[5]->d_un).d_val;
      do {
        if ((int)plVar24[1] == 0x25) {
          uVar13 = (*(code *)(plVar24[2] + l->l_addr))();
          *(undefined8 *)(*plVar24 + l->l_addr) = uVar13;
        }
        else {
          ppNVar19 = l->l_search_list;
          local_a8 = *ppNVar19;
          if (local_a8 != (NF_link_map *)0x0) {
            uVar17 = (ulong)*(uint *)(EVar2 + ((ulong)plVar24[1] >> 0x20) * 0x18);
            __s2 = (byte *)(EVar3 + uVar17);
            pvVar4 = records->pointer;
            do {
              if (pvVar4 != (void *)0x0) {
                iVar11 = strcmp(records->name,(char *)__s2);
                ppvVar25 = &records[1].pointer;
                pvVar21 = pvVar4;
                while( true ) {
                  if (iVar11 == 0) goto LAB_001031e7;
                  pvVar21 = *ppvVar25;
                  if (pvVar21 == (void *)0x0) break;
                  iVar11 = strcmp(((ProxyRecord *)(ppvVar25 + -1))->name,(char *)__s2);
                  ppvVar25 = ppvVar25 + 2;
                }
              }
              pEVar10 = local_a8->l_ld + -1;
              do {
                pEVar23 = pEVar10;
                pEVar10 = pEVar23 + 1;
              } while (pEVar23[1].d_tag != 5);
              EVar5 = pEVar23[1].d_un.d_val;
              do {
                pEVar23 = pEVar10;
                pEVar10 = pEVar23 + 1;
              } while (pEVar23->d_tag != 6);
              bVar16 = *__s2;
              if (bVar16 == 0) {
                uVar14 = 0x1505;
              }
              else {
                uVar14 = 0x1505;
                pbVar20 = (byte *)(uVar17 + EVar3 + 1);
                do {
                  uVar14 = (ulong)bVar16 + uVar14 * 0x21;
                  bVar16 = *pbVar20;
                  pbVar20 = pbVar20 + 1;
                } while (bVar16 != 0);
                uVar14 = uVar14 & 0xffffffff;
              }
              if ((((uint)(local_a8->l_gnu_bitmask
                           [(uint)(uVar14 >> 6) & local_a8->l_gnu_bitmask_idxbits] >>
                          ((byte)uVar14 & 0x3f)) &
                    (uint)(local_a8->l_gnu_bitmask
                           [(uint)(uVar14 >> 6) & local_a8->l_gnu_bitmask_idxbits] >>
                          ((byte)(uVar14 >> ((byte)local_a8->l_gnu_shift & 0x3f)) & 0x3f)) & 1) != 0
                  ) && ((ulong)local_a8->l_gnu_buckets[uVar14 % (ulong)local_a8->l_nbuckets] != 0))
              {
                EVar6 = (pEVar23->d_un).d_val;
                pEVar7 = local_a8->l_gnu_chain_zero;
                uVar26 = (ulong)local_a8->l_gnu_buckets[uVar14 % (ulong)local_a8->l_nbuckets] << 2;
LAB_00103155:
                uVar1 = *(uint *)((long)pEVar7 + uVar26);
                if (1 < ((uint)uVar14 ^ uVar1)) goto LAB_0010318a;
                uVar15 = uVar26 >> 2 & 0xffffffff;
                iVar11 = strcmp((char *)(*(uint *)(EVar6 + uVar15 * 0x18) + EVar5),(char *)__s2);
                if (iVar11 != 0) goto LAB_0010318a;
                pvVar21 = (void *)(local_a8->l_addr + *(long *)(EVar6 + uVar15 * 0x18 + 8));
LAB_001031e7:
                *(long *)(*plVar24 + l->l_addr) = (long)pvVar21 + plVar24[2];
                break;
              }
LAB_00103194:
              local_a8 = ppNVar19[1];
              ppNVar19 = ppNVar19 + 1;
            } while (local_a8 != (NF_link_map *)0x0);
          }
        }
        plVar24 = plVar24 + 3;
      } while (plVar24 < plVar22);
    }
    lVar18 = 1;
    bVar9 = !bVar8;
    bVar8 = false;
    if (bVar9) {
      return;
    }
  } while( true );
LAB_0010318a:
  uVar26 = uVar26 + 4;
  if ((uVar1 & 1) != 0) goto LAB_00103194;
  goto LAB_00103155;
}

Assistant:

void NFreloc(struct NF_link_map *l, const ProxyRecord *records)
{
    /* set up range[0] for relative reloc and global vars */
    if (l->l_info[DT_RELA])
    {
        ranges[0].start = l->l_info[DT_RELA]->d_un.d_ptr;
        ranges[0].size = l->l_info[DT_RELASZ]->d_un.d_val;
        ranges[0].nrelative = l->l_info[34]->d_un.d_val; //relacount is now at 34
    }
    /* set up range[1] for function reloc */
    if (l->l_info[DT_PLTREL]) //TODO: Also check reloc type: it is REL/RELA? Only 2 options?
    {
        ranges[1].start = l->l_info[DT_JMPREL]->d_un.d_ptr;
        ranges[1].size = l->l_info[DT_PLTRELSZ]->d_un.d_val;
        //TODO: check lazy or not here
    }

    /* do actucal reloc here using ranges set up */
    for (int i = 0; i < 2; ++i)
        do_reloc(l, &ranges[i], records);

    /* UPD: this is totally wrong, for unload search list should be in the destructor of the NF */
    /* NFclose function should take care of this */
    /* now the reloc is done, dlclose the dlopened objs before */
    /* struct link_map **lm = l -> l_search_list;
    while(*lm)
    {
        dlclose(*lm);
        lm++;
    } */
    //TODO: add a mprotect to protect the already relocated entries from writing
}